

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_kernel_1.h
# Opt level: O2

int __thiscall dlib::rand::init(rand *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 10000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    random_helpers::
    mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
    ::operator()(&this->mt);
  }
  this->max_val = 281474976710655.06;
  this->has_gaussian = false;
  this->next_gaussian = 0.0;
  return -0x1e;
}

Assistant:

void init()
            {
                // prime the generator a bit
                for (int i = 0; i < 10000; ++i)
                    mt();

                max_val =  0xFFFFFF;
                max_val *= 0x1000000;
                max_val += 0xFFFFFF;
                max_val += 0.05;


                has_gaussian = false;
                next_gaussian = 0;
            }